

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O0

Vec_Flt_t * Abc_NtkTestCreateRequired(int nOutputs)

{
  Vec_Flt_t *p_00;
  undefined4 local_1c;
  int i;
  Vec_Flt_t *p;
  int nOutputs_local;
  
  p_00 = Vec_FltAlloc(nOutputs);
  for (local_1c = 0; local_1c < nOutputs; local_1c = local_1c + 1) {
    Vec_FltPush(p_00,(float)local_1c + 100.0);
  }
  return p_00;
}

Assistant:

Vec_Flt_t * Abc_NtkTestCreateRequired( int nOutputs )
{
    Vec_Flt_t * p;
    int i;
    p = Vec_FltAlloc( nOutputs );
    for ( i = 0; i < nOutputs; i++ )
        Vec_FltPush( p, 100.0 + 1.0*i );
    return p;
}